

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

int __thiscall QFileSystemModelPrivate::init(QFileSystemModelPrivate *this,EVP_PKEY_CTX *ctx)

{
  QFileInfoGatherer *pQVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  long in_FS_OFFSET;
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTimer::setSingleShot(SUB81(&this->delayedSortTimer,0));
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QList<std::pair<QString,_QFileInfo>_>_>::metaType.typeId.
      _q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QList<std::pair<QString,_QFileInfo>_>_>::
                metaType);
  }
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  local_48 = QFileInfoGatherer::newListOfFiles;
  local_40 = 0;
  local_58 = directoryChanged;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&this->field_0x8;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileSystemModelPrivate::*)(const_QString_&,_const_QList<QString>_&),_QtPrivate::List<const_QString_&,_const_QList<QString>_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = directoryChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  local_48 = QFileInfoGatherer::updates;
  local_40 = 0;
  local_58 = fileSystemChanged;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&this->field_0x8;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileSystemModelPrivate::*)(const_QString_&,_const_QList<std::pair<QString,_QFileInfo>_>_&),_QtPrivate::List<const_QString_&,_const_QList<std::pair<QString,_QFileInfo>_>_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = fileSystemChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  local_48 = QFileInfoGatherer::nameResolved;
  local_40 = 0;
  local_58 = resolvedName;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&this->field_0x8;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileSystemModelPrivate::*)(const_QString_&,_const_QString_&),_QtPrivate::List<const_QString_&,_const_QString_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = resolvedName;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  ppvVar2 = *(void ***)&this->field_0x8;
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  local_58 = QFileSystemModel::directoryLoaded;
  local_50 = (ImplFn)0x0;
  local_48 = QFileInfoGatherer::directoryLoaded;
  local_40 = 0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<void_(QFileSystemModel::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QFileSystemModel::directoryLoaded;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)pQVar1,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  local_48 = QTimer::timeout;
  local_40 = 0;
  local_58 = performDelayedSort;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&this->field_0x8;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileSystemModelPrivate::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar3 + 4) = performDelayedSort;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)&this->delayedSortTimer,(QObject *)&local_48,ppvVar2,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar3,(int *)0x2,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::init()
{
    delayedSortTimer.setSingleShot(true);

    qRegisterMetaType<QList<std::pair<QString, QFileInfo>>>();
#if QT_CONFIG(filesystemwatcher)
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::newListOfFiles,
                            this, &QFileSystemModelPrivate::directoryChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::updates,
                            this, &QFileSystemModelPrivate::fileSystemChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::nameResolved,
                            this, &QFileSystemModelPrivate::resolvedName);
    Q_Q(QFileSystemModel);
    q->connect(fileInfoGatherer.get(), &QFileInfoGatherer::directoryLoaded,
               q, &QFileSystemModel::directoryLoaded);
#endif // filesystemwatcher
    QObjectPrivate::connect(&delayedSortTimer, &QTimer::timeout,
                            this, &QFileSystemModelPrivate::performDelayedSort,
                            Qt::QueuedConnection);
}